

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  RangeListSyntax *this;
  WithClauseSyntax *args_1;
  RangeCoverageBinInitializerSyntax *pRVar1;
  BumpAllocator *in_stack_ffffffffffffffc8;
  RangeListSyntax *in_stack_ffffffffffffffd0;
  
  not_null<slang::syntax::RangeListSyntax_*>::operator*
            ((not_null<slang::syntax::RangeListSyntax_*> *)0xa5d976);
  this = deepClone<slang::syntax::RangeListSyntax>
                   (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (*(long *)(__fn + 0x20) == 0) {
    args_1 = (WithClauseSyntax *)0x0;
  }
  else {
    args_1 = deepClone<slang::syntax::WithClauseSyntax>
                       ((WithClauseSyntax *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  pRVar1 = BumpAllocator::
           emplace<slang::syntax::RangeCoverageBinInitializerSyntax,slang::syntax::RangeListSyntax&,slang::syntax::WithClauseSyntax*>
                     ((BumpAllocator *)this,(RangeListSyntax *)__child_stack,
                      (WithClauseSyntax **)args_1);
  return (int)pRVar1;
}

Assistant:

static SyntaxNode* clone(const RangeCoverageBinInitializerSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<RangeCoverageBinInitializerSyntax>(
        *deepClone<RangeListSyntax>(*node.ranges, alloc),
        node.withClause ? deepClone(*node.withClause, alloc) : nullptr
    );
}